

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JsonReporter::endListing(JsonReporter *this)

{
  JsonReporter *in_RDI;
  
  if ((in_RDI->m_startedListing & 1U) != 0) {
    endObject(in_RDI);
  }
  in_RDI->m_startedListing = false;
  return;
}

Assistant:

void JsonReporter::endListing() {
        if ( m_startedListing ) { endObject(); }
        m_startedListing = false;
    }